

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O1

monst * restmonchn(memfile *mf,level *lev,boolean ghostly)

{
  uint nid;
  boolean bVar1;
  int32_t iVar2;
  int mndx;
  monst *shkp;
  obj *poVar3;
  monst *pmVar4;
  obj *poVar5;
  monst *pmVar6;
  monst *pmVar7;
  
  mfmagic_check(mf,0x4e48434d);
  iVar2 = mread32(mf);
  if (iVar2 == 0) {
    pmVar4 = (monst *)0x0;
    shkp = (monst *)0x0;
  }
  else {
    pmVar6 = (monst *)0x0;
    pmVar7 = (monst *)0x0;
    do {
      shkp = restore_mon(mf);
      pmVar4 = shkp;
      if (pmVar6 != (monst *)0x0) {
        pmVar7->nmon = shkp;
        pmVar4 = pmVar6;
      }
      shkp->dlevel = lev;
      nid = flags.ident;
      if (ghostly != '\0') {
        flags.ident = flags.ident + 1;
        add_id_mapping(shkp->m_id,nid);
        shkp->m_id = nid;
        mndx = monsndx(shkp->data);
        bVar1 = propagate(mndx,'\x01',ghostly);
        if (bVar1 == '\0') {
          shkp->mhpmax = -100;
        }
      }
      poVar5 = (obj *)&shkp->minvent;
      if (shkp->minvent != (obj *)0x0) {
        poVar3 = restobjchn(mf,lev,ghostly,'\0');
        *(obj **)poVar5 = poVar3;
        for (; poVar3 != (obj *)0x0; poVar3 = poVar3->nobj) {
          (poVar3->v).v_ocarry = shkp;
        }
      }
      if (shkp->mw != (obj *)0x0) {
        do {
          poVar5 = poVar5->nobj;
          if (poVar5 == (obj *)0x0) {
            shkp->mw = (obj *)0x0;
            impossible("bad monster weapon restore");
            goto LAB_00234270;
          }
        } while ((poVar5->owornmask & 0x100) == 0);
        shkp->mw = poVar5;
      }
LAB_00234270:
      if ((shkp->field_0x63 & 2) != 0) {
        restshk(shkp,ghostly);
      }
      if ((shkp->field_0x63 & 0x10) != 0) {
        restpriest(shkp,ghostly);
      }
      iVar2 = iVar2 + -1;
      pmVar6 = pmVar4;
      pmVar7 = shkp;
    } while (iVar2 != 0);
  }
  if ((pmVar4 != (monst *)0x0) && (shkp->nmon != (monst *)0x0)) {
    impossible("Restmonchn: error reading monchn.");
    shkp->nmon = (monst *)0x0;
  }
  return pmVar4;
}

Assistant:

static struct monst *restmonchn(struct memfile *mf, struct level *lev, boolean ghostly)
{
	struct monst *mtmp, *mtmp2 = NULL;
	struct monst *first = NULL;
	struct obj *obj;
	unsigned int count, mndx;

	/* get the original base address */
	mfmagic_check(mf, MONCHAIN_MAGIC);
	count = mread32(mf);

	while (count--) {
	    mtmp = restore_mon(mf);
	    if (!first)
		first = mtmp;
	    else
		mtmp2->nmon = mtmp;
	    mtmp->dlevel = lev;
	    
	    if (ghostly) {
		unsigned nid = flags.ident++;
		add_id_mapping(mtmp->m_id, nid);
		mtmp->m_id = nid;

		mndx = monsndx(mtmp->data);
		if (propagate(mndx, TRUE, ghostly) == 0) {
		    /* cookie to trigger purge in getbones() */
		    mtmp->mhpmax = DEFUNCT_MONSTER;	
		}
	    }
	    
	    if (mtmp->minvent) {
		mtmp->minvent = restobjchn(mf, lev, ghostly, FALSE);
		/* restore monster back pointer */
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    obj->ocarry = mtmp;
	    }
	    
	    if (mtmp->mw) {
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    if (obj->owornmask & W_WEP) break;
		if (obj) mtmp->mw = obj;
		else {
		    MON_NOWEP(mtmp);
		    impossible("bad monster weapon restore");
		}
	    }

	    if (mtmp->isshk) restshk(mtmp, ghostly);
	    if (mtmp->ispriest) restpriest(mtmp, ghostly);

	    mtmp2 = mtmp;
	}
	if (first && mtmp2->nmon){
	    impossible("Restmonchn: error reading monchn.");
	    mtmp2->nmon = 0;
	}
	
	return first;
}